

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGenerator.cxx
# Opt level: O1

cmCPackInstallationType * __thiscall
cmCPackGenerator::GetInstallationType(cmCPackGenerator *this,string *projectName,string *name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  const_iterator cVar3;
  mapped_type *pmVar4;
  long *plVar5;
  char *__s;
  long *plVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string macroPrefix;
  string local_70;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  cVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackInstallationType>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackInstallationType>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackInstallationType>_>_>
          ::find(&(this->InstallationTypes)._M_t,name);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackInstallationType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackInstallationType>_>_>
           ::operator[](&this->InstallationTypes,name);
  if ((_Rb_tree_header *)cVar3._M_node ==
      &(this->InstallationTypes)._M_t._M_impl.super__Rb_tree_header) {
    cmsys::SystemTools::UpperCase(&local_70,name);
    plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x4fdc44);
    plVar6 = plVar5 + 2;
    if ((long *)*plVar5 == plVar6) {
      local_40 = *plVar6;
      lStack_38 = plVar5[3];
      local_50 = &local_40;
    }
    else {
      local_40 = *plVar6;
      local_50 = (long *)*plVar5;
    }
    local_48 = plVar5[1];
    *plVar5 = (long)plVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    paVar1 = &local_70.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::_M_assign((string *)pmVar4);
    local_70._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,local_50,local_48 + (long)local_50);
    std::__cxx11::string::append((char *)&local_70);
    __s = GetOption(this,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if ((__s == (char *)0x0) || (*__s == '\0')) {
      std::__cxx11::string::_M_assign((string *)&pmVar4->DisplayName);
    }
    else {
      pcVar2 = (char *)(pmVar4->DisplayName)._M_string_length;
      strlen(__s);
      std::__cxx11::string::_M_replace((ulong)&pmVar4->DisplayName,0,pcVar2,(ulong)__s);
    }
    pmVar4->Index = (uint)(this->InstallationTypes)._M_t._M_impl.super__Rb_tree_header._M_node_count
    ;
    if (local_50 != &local_40) {
      operator_delete(local_50,local_40 + 1);
    }
  }
  return pmVar4;
}

Assistant:

cmCPackInstallationType*
cmCPackGenerator::GetInstallationType(const std::string& projectName,
                                      const std::string& name)
{
  (void) projectName;
  bool hasInstallationType = this->InstallationTypes.count(name) != 0;
  cmCPackInstallationType *installType = &this->InstallationTypes[name];
  if (!hasInstallationType)
    {
    // Define the installation type
    std::string macroPrefix = "CPACK_INSTALL_TYPE_"
      + cmsys::SystemTools::UpperCase(name);
    installType->Name = name;

    const char* displayName
      = this->GetOption(macroPrefix + "_DISPLAY_NAME");
    if (displayName && *displayName)
      {
      installType->DisplayName = displayName;
      }
    else
      {
      installType->DisplayName = installType->Name;
      }

    installType->Index = static_cast<unsigned>(
      this->InstallationTypes.size());
    }
  return installType;
}